

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O3

void __thiscall
aggreports::WheatsheafAndWheatsheafMeanWithWeighting
          (aggreports *this,vector<int,_std::allocator<int>_> *handles,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar,
          int ensemble_id)

{
  int iVar1;
  pointer pmVar2;
  int *piVar3;
  pointer pmVar4;
  void *pvVar5;
  int eptype_00;
  mapped_type *pmVar6;
  code *pcVar7;
  _Base_ptr p_Var8;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var9;
  mapped_type *pmVar10;
  _Rb_tree_node_base *p_Var11;
  int *piVar12;
  undefined4 in_register_0000000c;
  int __tmp;
  long *plVar13;
  _Base_ptr p_Var14;
  bool *pbVar15;
  OASIS_FLOAT OVar16;
  outkey2 oVar17;
  vector<int,_std::allocator<int>_> fileIDs;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  unusedperiodstoweighting;
  map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  items;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> maxPeriodNo;
  vector<int,_std::allocator<int>_> local_128;
  allocator_type local_101;
  vector<int,_std::allocator<int>_> *local_100;
  int local_f8;
  int local_f4;
  _Base_ptr local_f0;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *local_e8;
  _Base_ptr local_e0;
  value_type local_d8;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_c0;
  _Rb_tree<wheatkey,_std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>,_std::_Select1st<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_100 = handles;
  local_f8 = eptype;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::_Rb_tree(&local_c0,&(this->periodstoweighting_)._M_t);
  local_f4 = eptype_tvar;
  if ((int)fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start == 0) {
    pmVar2 = (this->out_loss_->
             super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    p_Var8 = *(_Base_ptr *)((long)&pmVar2[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
    p_Var14 = &pmVar2[1]._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var8 != p_Var14) {
      plVar13 = (long *)((long)&local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish +
                        CONCAT44(in_register_0000000c,epcalc) + 4U);
      do {
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = p_Var8[1]._M_color;
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._4_4_ = *(undefined4 *)&p_Var8[1].field_0x4;
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = *(int *)&p_Var8[1]._M_parent;
        oVar17 = *(outkey2 *)(p_Var8 + 1);
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish._4_4_ = *(undefined4 *)((long)&p_Var8[1]._M_parent + 4);
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)CONCAT44(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_,
                               *(undefined4 *)&p_Var8[1]._M_left);
        pcVar7 = (code *)GetOutLoss;
        if ((GetOutLoss & 1) != 0) {
          pcVar7 = *(code **)(*plVar13 + -1 + GetOutLoss);
        }
        OVar16 = (OASIS_FLOAT)(*pcVar7)(plVar13);
        FillWheatsheafItems(this,oVar17,
                            (map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                             *)&local_90,OVar16,
                            (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_60,
                            (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_c0);
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while (p_Var8 != p_Var14);
    }
  }
  else {
    local_e8 = &this->ensembletosidx_;
    std::
    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::operator[](local_e8,(key_type *)&fileIDs);
    pmVar2 = (this->out_loss_->
             super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    p_Var8 = *(_Base_ptr *)((long)&pmVar2[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
    local_f0 = &pmVar2[1]._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var8 != local_f0) {
      plVar13 = (long *)((long)&local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish +
                        CONCAT44(in_register_0000000c,epcalc) + 4U);
      do {
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)CONCAT44(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_,
                               *(undefined4 *)&p_Var8[1]._M_left);
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = (_Rb_tree_color)*(undefined8 *)(p_Var8 + 1);
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._4_4_ = (undefined4)((ulong)*(undefined8 *)(p_Var8 + 1) >> 0x20);
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = (int)p_Var8[1]._M_parent;
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish._4_4_ = (undefined4)((ulong)p_Var8[1]._M_parent >> 0x20);
        local_e0 = p_Var8;
        pmVar6 = std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[](local_e8,(key_type *)&fileIDs);
        piVar3 = (pmVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (piVar12 = (pmVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start; piVar12 != piVar3; piVar12 = piVar12 + 1) {
          iVar1 = *piVar12;
          if ((int)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish == iVar1) {
            pcVar7 = (code *)GetOutLoss;
            if ((GetOutLoss & 1) != 0) {
              pcVar7 = *(code **)(*plVar13 + -1 + GetOutLoss);
            }
            oVar17.period_no =
                 local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_;
            oVar17.summary_id =
                 (_Rb_tree_color)
                 local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            OVar16 = (OASIS_FLOAT)(*pcVar7)(plVar13);
            oVar17.sidx = iVar1;
            FillWheatsheafItems(this,oVar17,
                                (map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                                 *)&local_90,OVar16,
                                (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                 *)&local_60,
                                (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                 *)&local_c0);
          }
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(local_e0);
      } while (p_Var8 != local_f0);
    }
  }
  pbVar15 = this->outputFlags_;
  piVar12 = (local_100->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pbVar15[piVar12[1]] == true) {
    this_00 = (_Rb_tree<int,_std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
               *)operator_new(0x30);
    p_Var9 = &(((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header;
    (((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)0x0;
    *(undefined8 *)&((_Rep_type *)&this_00->_M_impl)->_M_impl = 0;
    *(undefined8 *)&(((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header = 0;
    (((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_left =
         &p_Var9->_M_header;
    (((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_right =
         &p_Var9->_M_header;
    (((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_node_count = 0;
    p_Var11 = (this->summaryids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var9 = &(this->summaryids_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var11 != p_Var9) {
      do {
        local_d8.retperiod = 0.0;
        local_d8.mean = 0.0;
        local_d8.count = 0;
        local_d8._20_4_ = 0;
        std::vector<mean_count,_std::allocator<mean_count>_>::vector
                  ((vector<mean_count,_std::allocator<mean_count>_> *)&local_128,
                   (long)(this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2,&local_d8,&local_101);
        pmVar10 = std::
                  map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                  ::operator[]((map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                                *)this_00,(key_type *)(p_Var11 + 1));
        pmVar4 = (pmVar10->super__Vector_base<mean_count,_std::allocator<mean_count>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        (pmVar10->super__Vector_base<mean_count,_std::allocator<mean_count>_>)._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               (_Rb_tree_color)
                               local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start);
        (pmVar10->super__Vector_base<mean_count,_std::allocator<mean_count>_>)._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish._4_4_,
                               (int)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish);
        (pmVar10->super__Vector_base<mean_count,_std::allocator<mean_count>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = _S_red;
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._4_4_ = 0;
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = 0;
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish._4_4_ = 0;
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        if (pmVar4 != (pointer)0x0) {
          operator_delete(pmVar4);
          if ((void *)CONCAT44(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               (_Rb_tree_color)
                               local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) != (void *)0x0) {
            operator_delete((void *)CONCAT44(local_128.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             (_Rb_tree_color)
                                             local_128.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_start));
          }
        }
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != p_Var9);
      pbVar15 = this->outputFlags_;
      piVar12 = (local_100->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
  }
  else {
    this_00 = (_Rb_tree<int,_std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
               *)0x0;
  }
  eptype_00 = local_f4;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = 0;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  iVar1 = *piVar12;
  if (pbVar15[iVar1] == true) {
    if (this->ordFlag_ == true) {
      if (this->fout_[1] == (FILE *)0x0) goto LAB_00109757;
      piVar12 = (int *)operator_new(4);
      *piVar12 = 1;
    }
    else {
      piVar12 = (int *)operator_new(4);
      *piVar12 = iVar1;
    }
    operator_delete(piVar12);
  }
LAB_00109757:
  WritePerSampleExceedanceProbabilityTable
            (this,&local_128,
             (map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
              *)&local_90,eptype_00,ensemble_id,
             (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
             &local_c0,
             (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
              *)this_00);
  iVar1 = (local_100->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
          ._M_start[1];
  if (this->outputFlags_[iVar1] != false) {
    if (this->ordFlag_ == true) {
      if (*this->fout_ == (FILE *)0x0) {
        piVar12 = (int *)0x0;
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (int *)0x0;
      }
      else {
        piVar12 = (int *)operator_new(4);
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = piVar12 + 1;
        *piVar12 = 0;
      }
    }
    else {
      piVar12 = (int *)operator_new(4);
      local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = piVar12 + 1;
      *piVar12 = iVar1;
    }
    pvVar5 = (void *)CONCAT44(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (_Rb_tree_color)
                              local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
    local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_4_ = (_Rb_tree_color)piVar12;
    local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._4_4_ = (undefined4)((ulong)piVar12 >> 0x20);
    local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ =
         (int)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish._4_4_ =
         (undefined4)
         ((ulong)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage >> 0x20);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5);
    }
    WriteWheatsheafMean(this,&local_128,local_f8,eptype_00,ensemble_id,
                        (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                         *)this_00);
    if (this_00 !=
        (_Rb_tree<int,_std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
         *)0x0) {
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
      ::~_Rb_tree(this_00);
    }
    operator_delete(this_00);
  }
  if ((void *)CONCAT44(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       (_Rb_tree_color)
                       local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     (_Rb_tree_color)
                                     local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start));
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<wheatkey,_std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>,_std::_Select1st<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  ::~_Rb_tree(&local_90);
  return;
}

Assistant:

void aggreports::WheatsheafAndWheatsheafMeanWithWeighting(
	const std::vector<int> handles, OASIS_FLOAT (OutLosses::*GetOutLoss)(),
	const int epcalc, const int eptype, const int eptype_tvar,
	int ensemble_id) {

  std::map<wheatkey, lossvec2> items;
  int samplesize;
  std::map<int, int> maxPeriodNo;
  std::map<int, double> unusedperiodstoweighting = periodstoweighting_;

  if (ensemble_id != 0) {
    samplesize = (int)ensembletosidx_[ensemble_id].size();
    for (auto x : (*out_loss_)[SAMPLES]) {
      for (auto sidx : ensembletosidx_[ensemble_id]) {
	if (x.first.sidx == sidx) {
	  FillWheatsheafItems(x.first, items, (x.second.*GetOutLoss)(),
			      maxPeriodNo, unusedperiodstoweighting);
	}
      }
    }
  } else {
    samplesize = samplesize_;
    for (auto x : (*out_loss_)[SAMPLES]) {
      FillWheatsheafItems(x.first, items, (x.second.*GetOutLoss)(),
			  maxPeriodNo, unusedperiodstoweighting);
    }
  }

  // Map for Wheatsheaf mean - calculate Wheatsheaf mean at same time as
  // Wheatsheaf. There is no need to check for a return period file, as
  // this is checked earlier in aggreports::LoadPeriodsToWeighting().
  std::map<int, std::vector<mean_count>> *temp_map = nullptr;
  if (outputFlags_[handles[WHEATSHEAF_MEAN]]) {
    temp_map = new std::map<int, std::vector<mean_count>>();
    for (auto it = summaryids_.begin(); it != summaryids_.end(); ++it) {
      (*temp_map)[*it] = std::vector<mean_count>(returnperiods_.size(),
						 mean_count());
    }
  }


  std::vector<int> fileIDs;
  if (outputFlags_[handles[WHEATSHEAF]] == true) {
    std::vector<int> fileIDs = GetFileIDs(handles[WHEATSHEAF], PSEPT);
  }
  WritePerSampleExceedanceProbabilityTable(fileIDs, items, eptype, eptype_tvar,
					   unusedperiodstoweighting, temp_map);

  if (outputFlags_[handles[WHEATSHEAF_MEAN]] == false) return;

  fileIDs = GetFileIDs(handles[WHEATSHEAF_MEAN]);
  WriteWheatsheafMean(fileIDs, epcalc, eptype, eptype_tvar, temp_map);

  delete temp_map;   // tidy up
  temp_map = nullptr;

}